

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::lineMesh(Mesh *__return_storage_ptr__,vec3 *_a,vec3 *_b)

{
  undefined4 uVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_28;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_24;
  undefined4 uStack_20;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_1c;
  undefined8 local_18;
  
  uVar1 = _a->field_2;
  local_28 = _a->field_0;
  aStack_24 = _a->field_1;
  aStack_1c = _b->field_0;
  local_18._0_4_ = _b->field_1;
  local_18._4_4_ = _b->field_2;
  uStack_20 = uVar1;
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::addVertices(__return_storage_ptr__,(vec3 *)&local_28,2);
  __return_storage_ptr__->m_drawMode = LINES;
  return __return_storage_ptr__;
}

Assistant:

Mesh lineMesh(const glm::vec3 &_a, const glm::vec3 &_b) {
    glm::vec3 linePoints[2];
    linePoints[0] = glm::vec3(_a.x,_a.y,_a.z);
    linePoints[1] = glm::vec3(_b.x,_b.y,_b.z);;

    Mesh mesh;
    mesh.addVertices(linePoints,2);
    mesh.setDrawMode(LINES);
    return mesh;
}